

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void env_routine_put(Routine r,int line,Environment *env)

{
  Object value;
  Record *pRVar1;
  char *__format;
  Object record;
  undefined4 uStack_5c;
  
  pRVar1 = env_match(r.name,env);
  if (pRVar1 != (Record *)0x0) {
    __format = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a routine in the same scope!\x1b[0m"
    ;
    if ((pRVar1->object).type == OBJECT_ROUTINE) {
      __format = "\x1b[31m\n[Runtime Error] [Line:%d] Routine %s is already defined!\x1b[0m";
    }
    printf(__format,line,r.name);
    stop();
  }
  value._4_4_ = uStack_5c;
  value.type = 3;
  value.field_1.instance = (Instance *)r._0_8_;
  value.field_1.routine.name = r.name;
  value.field_1._16_8_ = r._16_8_;
  value.field_1.routine.arguments = r.arguments;
  value.field_1._32_8_ = r._32_8_;
  value.field_1.container.constructor.statements = (Statement *)r.code._0_8_;
  value.field_1.routine.code.statements = r.code.statements;
  rec_new(r.name,value,env);
  return;
}

Assistant:

void env_routine_put(Routine r, int line, Environment *env){
    Record *match = env_match(r.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_ROUTINE){
            printf(runtime_error("Identifer %s cannot be redefined as a routine in the same scope!"), line, r.name);
        }
        else{
            printf(runtime_error("Routine %s is already defined!"), line, r.name);
        }
        stop();
    }

    Object record;
    record.type = OBJECT_ROUTINE;
    record.routine = r;

    rec_new(r.name, record, env);
}